

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  char *local_18;
  long local_10;
  
  local_18 = id;
  if (id == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmPolicies.cxx"
                  ,0xe,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  sVar3 = strlen(id);
  if ((sVar3 == 7) &&
     (bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&local_18,(char (*) [4])"CMP"), bVar2)) {
    bVar2 = cmHasLiteralSuffix<char_const*,5ul>(&local_18,(char (*) [5])0x4b9367);
    if (bVar2) {
      *pid = CMP0000;
      return true;
    }
    lVar4 = 0;
    do {
      if (lVar4 == 4) {
        bVar2 = cmSystemTools::StringToLong(local_18 + 3,&local_10);
        if (!bVar2) {
          return false;
        }
        if (0x41 < local_10) {
          return false;
        }
        *pid = (PolicyID)local_10;
        return true;
      }
      lVar1 = lVar4 + 3;
      lVar4 = lVar4 + 1;
    } while ((int)local_18[lVar1] - 0x30U < 10);
  }
  return false;
}

Assistant:

bool cmPolicies::GetPolicyID(const char *id, cmPolicies::PolicyID &pid)
{
  return stringToId(id, pid);
}